

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z80.cpp
# Opt level: O0

void Z80::OpCode_LR35902_STOP(void)

{
  byte bVar1;
  int iVar2;
  
  EmitByte(0x10,true);
  iVar2 = SkipBlanks(&::lp);
  if (iVar2 == 0) {
    bVar1 = GetByteNoMem(&::lp,false);
    EmitByte((uint)bVar1,false);
  }
  else {
    EmitByte(0,false);
  }
  return;
}

Assistant:

static void OpCode_LR35902_STOP() {	// syntax: STOP [byte_value = 0] = opcode "10 byte_value"
		EmitByte(0x10, true);
		if (SkipBlanks(lp)) {		// is optional byte provided? (if not, default value is zero)
			EmitByte(0x00);
		} else {
			EmitByte(GetByteNoMem(lp));
		}
	}